

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O0

void __thiscall tetgenmesh::outhullfaces(tetgenmesh *this,tetgenio *out)

{
  point pt;
  point pt_00;
  undefined1 auVar1 [16];
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  uint local_474;
  int local_468;
  uint local_464;
  int index;
  int facenumber;
  int shift;
  int firstindex;
  int *elist;
  point tapex;
  point tdest;
  point torg;
  triface hulltet;
  char facefilename [1024];
  FILE *local_20;
  FILE *outfile;
  tetgenio *out_local;
  tetgenmesh *this_local;
  
  local_20 = (FILE *)0x0;
  triface::triface((triface *)&torg);
  _shift = (int *)0x0;
  if (out == (tetgenio *)0x0) {
    strcpy((char *)&hulltet.ver,this->b->outfilename);
    strcat((char *)&hulltet.ver,".face");
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",&hulltet.ver);
    }
    else {
      printf("Writing faces.\n");
    }
  }
  if (out == (tetgenio *)0x0) {
    local_20 = fopen((char *)&hulltet.ver,"w");
    if (local_20 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",&hulltet.ver);
      terminatetetgen(this,1);
    }
    fprintf(local_20,"%ld  0\n",this->hullsize);
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = this->hullsize * 3;
    uVar6 = SUB168(auVar1 * ZEXT816(4),0);
    if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
      uVar6 = 0xffffffffffffffff;
    }
    piVar7 = (int *)operator_new__(uVar6);
    out->trifacelist = piVar7;
    if (out->trifacelist == (int *)0x0) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this,1);
    }
    out->numberoftrifaces = (int)this->hullsize;
    _shift = out->trifacelist;
    local_468 = 0;
  }
  if (this->b->zeroindex == 0) {
    local_474 = this->in->firstnumber;
  }
  else {
    local_474 = 0;
  }
  index = 0;
  if ((this->in->firstnumber == 1) && (local_474 == 0)) {
    index = 1;
  }
  memorypool::traversalinit(this->tetrahedrons);
  torg = (point)alltetrahedrontraverse(this);
  local_464 = local_474;
  while (torg != (point)0x0) {
    bVar2 = ishulltet(this,(triface *)&torg);
    if (bVar2) {
      pt = (point)torg[5];
      pt_00 = (point)torg[6];
      if (out == (tetgenio *)0x0) {
        iVar3 = pointmark(this,(point)torg[4]);
        iVar4 = pointmark(this,pt);
        iVar5 = pointmark(this,pt_00);
        fprintf(local_20,"%5d   %4d  %4d  %4d",(ulong)local_464,(ulong)(uint)(iVar3 - index),
                (ulong)(uint)(iVar4 - index),(ulong)(uint)(iVar5 - index));
        fprintf(local_20,"\n");
      }
      else {
        iVar3 = pointmark(this,(point)torg[4]);
        _shift[local_468] = iVar3 - index;
        iVar3 = pointmark(this,pt);
        iVar4 = local_468 + 2;
        _shift[local_468 + 1] = iVar3 - index;
        iVar3 = pointmark(this,pt_00);
        local_468 = local_468 + 3;
        _shift[iVar4] = iVar3 - index;
      }
      local_464 = local_464 + 1;
    }
    torg = (point)alltetrahedrontraverse(this);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_20,"# Generated by %s\n",this->b->commandline);
    fclose(local_20);
  }
  return;
}

Assistant:

void tetgenmesh::outhullfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface hulltet;
  point torg, tdest, tapex;
  int *elist = NULL;
  int firstindex, shift;
  int facenumber;
  int index;

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  0\n", hullsize);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[hullsize * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    out->numberoftrifaces = hullsize;
    elist = out->trifacelist;
    index = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  hulltet.tet = alltetrahedrontraverse();
  facenumber = firstindex;
  while (hulltet.tet != (tetrahedron *) NULL) {
    if (ishulltet(hulltet)) {
      torg = (point) hulltet.tet[4];
      tdest = (point) hulltet.tet[5];
      tapex = (point) hulltet.tet[6];
      if (out == (tetgenio *) NULL) {
        // Face number, indices of three vertices.
        fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                pointmark(torg) - shift, pointmark(tdest) - shift,
                pointmark(tapex) - shift);
        fprintf(outfile, "\n");
      } else {
        // Output indices of three vertices.
        elist[index++] = pointmark(torg) - shift;
        elist[index++] = pointmark(tdest) - shift;
        elist[index++] = pointmark(tapex) - shift;
      }
      facenumber++;
    }
    hulltet.tet = alltetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}